

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

void insert_node(qnode_ptr_t p,qnode_ptr_t *h,qnode_ptr_t *q)

{
  bool bVar1;
  qnode_ptr_t local_30;
  qnode_ptr_t t;
  qnode_ptr_t s;
  qnode_ptr_t *q_local;
  qnode_ptr_t *h_local;
  qnode_ptr_t p_local;
  
  local_30 = *h;
  t = (qnode_ptr_t)0x0;
  while( true ) {
    bVar1 = false;
    if (local_30 != (qnode_ptr_t)0x0) {
      bVar1 = p->level < local_30->level;
    }
    if (!bVar1) break;
    t = local_30;
    local_30 = local_30->forth;
  }
  if (t == (qnode_ptr_t)0x0) {
    *h = p;
  }
  else {
    t->forth = p;
  }
  if (local_30 == (qnode_ptr_t)0x0) {
    *q = p;
  }
  else {
    local_30->back = p;
  }
  p->back = t;
  p->forth = local_30;
  return;
}

Assistant:

void insert_node(p,h,q)
qnode_ptr_t p, *h, *q ;

{ qnode_ptr_t s, t ;

  t = *h ;
  s = (qnode_ptr_t)NULL ;
  while ((t != (qnode_ptr_t)NULL) && (p->level < t->level)) {
    s = t ;
    t = t->forth ;
  }
  if (s != (qnode_ptr_t)NULL) {
    s->forth = p ;
  }
  else {
    *h = p ;
  }
  if (t != (qnode_ptr_t)NULL) {
    t->back = p ;
  }
  else {
    *q = p ;
  }
  p->back = s ;
  p->forth = t ;
}